

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O1

If_LibBox_t * If_LibBoxRead(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  If_LibBox_t *p;
  size_t sVar6;
  char *__dest;
  If_Box_t *pBox;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar5 = "Cannot open file \"%s\".\n";
  }
  else {
    pcVar5 = If_LibBoxGetToken((FILE *)__stream);
    if (pcVar5 != (char *)0x0) {
      if (*pcVar5 == '.') {
        fclose(__stream);
        puts("Wrong box format. Please try \"read_box -e\".");
        return (If_LibBox_t *)0x0;
      }
      p = If_LibBoxStart();
      do {
        sVar6 = strlen(pcVar5);
        __dest = (char *)malloc(sVar6 + 1);
        strcpy(__dest,pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar1 = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar2 = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar3 = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar4 = atoi(pcVar5);
        pBox = (If_Box_t *)calloc(1,0x20);
        pBox->pName = __dest;
        pBox->Id = iVar1;
        pBox->fSeq = '\0';
        pBox->fBlack = iVar2 == 0;
        pBox->fOuter = '\0';
        pBox->nPis = iVar3;
        pBox->nPos = iVar4;
        uVar9 = iVar4 * iVar3;
        piVar7 = (int *)calloc((long)(int)uVar9,4);
        pBox->pDelays = piVar7;
        If_LibBoxAdd(p,pBox);
        if (0 < (int)uVar9) {
          uVar8 = 0;
          do {
            pcVar5 = If_LibBoxGetToken((FILE *)__stream);
            iVar1 = -1000000000;
            if (*pcVar5 != '-') {
              iVar1 = atoi(pcVar5);
            }
            pBox->pDelays[uVar8] = iVar1;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
      } while (pcVar5 != (char *)0x0);
      fclose(__stream);
      return p;
    }
    fclose(__stream);
    pcVar5 = "Cannot read library name from file \"%s\".\n";
  }
  printf(pcVar5,pFileName);
  return (If_LibBox_t *)0x0;
}

Assistant:

If_LibBox_t * If_LibBoxRead( char * pFileName )
{
    FILE * pFile;
    If_LibBox_t * p;
    If_Box_t * pBox;
    char * pToken, * pName;
    int i, Id, fBlack, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // get the library name
    pToken = If_LibBoxGetToken( pFile );
    if ( pToken == NULL )
    {
        fclose( pFile );
        printf( "Cannot read library name from file \"%s\".\n", pFileName );
        return NULL;
    }
    if ( pToken[0] == '.' )    
    {
        fclose( pFile );
        printf( "Wrong box format. Please try \"read_box -e\".\n" );
        return NULL;
    }
       
    // create library
    p = If_LibBoxStart();
    while ( pToken )
    {
        // save name
        pName  = Abc_UtilStrsav(pToken);
        // save ID
        pToken = If_LibBoxGetToken( pFile );
        Id     = atoi( pToken );
        // save white/black
        pToken = If_LibBoxGetToken( pFile );
        fBlack = !atoi( pToken );
        // save PIs
        pToken = If_LibBoxGetToken( pFile );
        nPis   = atoi( pToken );
        // save POs
        pToken = If_LibBoxGetToken( pFile );
        nPos   = atoi( pToken );
        // create box
        pBox   = If_BoxStart( pName, Id, nPis, nPos, 0, fBlack, 0 );
        If_LibBoxAdd( p, pBox );
        // read the table
        for ( i = 0; i < nPis * nPos; i++ )
        {
            pToken = If_LibBoxGetToken( pFile );
            pBox->pDelays[i] = (pToken[0] == '-') ? -ABC_INFINITY : atoi(pToken);
        }
        // extract next name
        pToken = If_LibBoxGetToken( pFile );
    }
    fclose( pFile );
    return p;
}